

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

bool __thiscall
chrono::ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>::SetValueAsString
          (ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> *this,string *mname)

{
  long lVar1;
  element_type *peVar2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  ulong uVar6;
  pointer pCVar7;
  ulong uVar8;
  bool bVar9;
  int numb;
  istringstream mstream;
  uint local_1cc;
  ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> *local_1c8;
  string *local_1c0;
  pointer local_1b8;
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  peVar2 = (this->enummap).
           super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pCVar7 = (peVar2->
           super__Vector_base<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(peVar2->
                super__Vector_base<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7;
  bVar9 = lVar5 != 0;
  local_1c8 = this;
  local_1c0 = mname;
  if (bVar9) {
    lVar5 = lVar5 >> 3;
    uVar6 = lVar5 * -0x3333333333333333;
    local_1b8 = (mname->_M_dataplus)._M_p;
    sVar3 = mname->_M_string_length;
    uVar8 = 1;
    do {
      __n = (pCVar7->name)._M_string_length;
      if ((__n == sVar3) &&
         ((__n == 0 || (iVar4 = bcmp(*(void **)&pCVar7->name,local_1b8,__n), iVar4 == 0)))) {
        *local_1c8->value_ptr = pCVar7->enumid;
        if (bVar9) {
          return true;
        }
        break;
      }
      bVar9 = uVar8 <= uVar6 && uVar6 - uVar8 != 0;
      pCVar7 = pCVar7 + 1;
      lVar1 = (lVar5 * 0x3333333333333333 - (ulong)(uVar6 == 0)) + 1 + uVar8;
      uVar8 = uVar8 + 1;
    } while (lVar1 != 1);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_1c0,_S_in);
  std::istream::operator>>((istringstream *)local_1b0,(int *)&local_1cc);
  bVar9 = (abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0;
  if (bVar9) {
    (*(local_1c8->super_ChEnumMapperBase)._vptr_ChEnumMapperBase[1])(local_1c8,(ulong)local_1cc);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return bVar9;
}

Assistant:

virtual bool SetValueAsString(const std::string& mname) override {
        for (int i = 0; i < enummap->size(); ++i) {
            if (enummap->at(i).name == mname) {
                *value_ptr = enummap->at(i).enumid;
                return true;
            }
        }
        // try to find from integer:
        int numb;
        std::istringstream mstream(mname);
        mstream >> numb;
        if (mstream.fail())
            return false;

        // Set value from number
        SetValueAsInt(numb);
        return true;
    }